

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.c
# Opt level: O0

MIR_reg_t new_temp_reg(MIR_context_t ctx,MIR_type_t type,MIR_func_t func)

{
  MIR_reg_t MVar1;
  MIR_error_func_t p_Var2;
  char *pcVar3;
  reg_desc_t *prVar4;
  char local_48 [8];
  char reg_name [30];
  MIR_func_t func_local;
  MIR_type_t type_local;
  MIR_context_t ctx_local;
  
  if ((((type != MIR_T_I64) && (type != MIR_T_F)) && (type != MIR_T_D)) && (type != MIR_T_LD)) {
    p_Var2 = MIR_get_error_func(ctx);
    pcVar3 = type_str(ctx,type);
    (*p_Var2)(MIR_reg_type_error,"wrong type %s for temporary register",pcVar3);
  }
  if (func == (MIR_func_t)0x0) {
    __assert_fail("func != ((void*)0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                  ,0x948,"MIR_reg_t new_temp_reg(MIR_context_t, MIR_type_t, MIR_func_t)");
  }
  do {
    func->last_temp_num = func->last_temp_num + 1;
    if (func->last_temp_num == 0) {
      p_Var2 = MIR_get_error_func(ctx);
      (*p_Var2)(MIR_unique_reg_error,"out of unique regs");
    }
    sprintf(local_48,"%s%d","t",(ulong)func->last_temp_num);
    prVar4 = find_rd_by_name(ctx,local_48,func);
  } while (prVar4 != (reg_desc_t *)0x0);
  MVar1 = MIR_new_func_reg(ctx,func,type,local_48);
  return MVar1;
}

Assistant:

static MIR_reg_t new_temp_reg (MIR_context_t ctx, MIR_type_t type, MIR_func_t func) {
  char reg_name[30];

  if (type != MIR_T_I64 && type != MIR_T_F && type != MIR_T_D && type != MIR_T_LD)
    MIR_get_error_func (ctx) (MIR_reg_type_error, "wrong type %s for temporary register",
                              type_str (ctx, type));
  mir_assert (func != NULL);
  for (;;) {
    func->last_temp_num++;
    if (func->last_temp_num == 0)
      MIR_get_error_func (ctx) (MIR_unique_reg_error, "out of unique regs");
    sprintf (reg_name, "%s%d", TEMP_REG_NAME_PREFIX, func->last_temp_num);

    if (find_rd_by_name (ctx, reg_name, func) == NULL)
      return MIR_new_func_reg (ctx, func, type, reg_name);
  }
}